

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3BitvecClear(Bitvec *p,u32 i,void *pBuf)

{
  uint uVar1;
  uint local_34;
  u32 h;
  u32 *aiValues;
  uint j;
  u32 bin;
  void *pBuf_local;
  Bitvec *pBStack_10;
  u32 i_local;
  Bitvec *p_local;
  
  if (p != (Bitvec *)0x0) {
    pBuf_local._4_4_ = i - 1;
    pBStack_10 = p;
    do {
      if (pBStack_10->iDivisor == 0) {
        if (pBStack_10->iSize < 0xf81) {
          (pBStack_10->u).aBitmap[pBuf_local._4_4_ >> 3] =
               (pBStack_10->u).aBitmap[pBuf_local._4_4_ >> 3] &
               ((byte)(1 << ((byte)pBuf_local._4_4_ & 7)) ^ 0xff);
          return;
        }
        memcpy(pBuf,&pBStack_10->u,0x1f0);
        memset(&pBStack_10->u,0,0x1f0);
        pBStack_10->nSet = 0;
        for (aiValues._0_4_ = 0; (uint)aiValues < 0x7c; aiValues._0_4_ = (uint)aiValues + 1) {
          if ((*(int *)((long)pBuf + (ulong)(uint)aiValues * 4) != 0) &&
             (*(int *)((long)pBuf + (ulong)(uint)aiValues * 4) != pBuf_local._4_4_ + 1)) {
            local_34 = (*(int *)((long)pBuf + (ulong)(uint)aiValues * 4) - 1U) % 0x7c;
            pBStack_10->nSet = pBStack_10->nSet + 1;
            while (*(int *)((long)&pBStack_10->u + (ulong)local_34 * 4) != 0) {
              local_34 = local_34 + 1;
              if (0x7b < local_34) {
                local_34 = 0;
              }
            }
            *(undefined4 *)((long)&pBStack_10->u + (ulong)local_34 * 4) =
                 *(undefined4 *)((long)pBuf + (ulong)(uint)aiValues * 4);
          }
        }
        return;
      }
      uVar1 = pBuf_local._4_4_ / pBStack_10->iDivisor;
      pBuf_local._4_4_ = pBuf_local._4_4_ % pBStack_10->iDivisor;
      pBStack_10 = *(Bitvec **)((long)&pBStack_10->u + (ulong)uVar1 * 8);
    } while (pBStack_10 != (Bitvec *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BitvecClear(Bitvec *p, u32 i, void *pBuf){
  if( p==0 ) return;
  assert( i>0 );
  i--;
  while( p->iDivisor ){
    u32 bin = i/p->iDivisor;
    i = i%p->iDivisor;
    p = p->u.apSub[bin];
    if (!p) {
      return;
    }
  }
  if( p->iSize<=BITVEC_NBIT ){
    p->u.aBitmap[i/BITVEC_SZELEM] &= ~(1 << (i&(BITVEC_SZELEM-1)));
  }else{
    unsigned int j;
    u32 *aiValues = pBuf;
    memcpy(aiValues, p->u.aHash, sizeof(p->u.aHash));
    memset(p->u.aHash, 0, sizeof(p->u.aHash));
    p->nSet = 0;
    for(j=0; j<BITVEC_NINT; j++){
      if( aiValues[j] && aiValues[j]!=(i+1) ){
        u32 h = BITVEC_HASH(aiValues[j]-1);
        p->nSet++;
        while( p->u.aHash[h] ){
          h++;
          if( h>=BITVEC_NINT ) h = 0;
        }
        p->u.aHash[h] = aiValues[j];
      }
    }
  }
}